

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

void VP8LColorSpaceTransform
               (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image)

{
  int *piVar1;
  byte bVar2;
  uint3 uVar3;
  VP8LMultipliers VVar4;
  int iVar5;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t *puVar12;
  int iVar13;
  undefined4 in_register_00000034;
  long lVar14;
  int iVar15;
  undefined4 in_register_0000003c;
  VP8LMultipliers local_904;
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  int local_8f4;
  uint local_8f0;
  int local_8ec;
  ulong local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  ulong local_8d0;
  uint local_8c4;
  int local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  long local_8b0;
  uint32_t *local_8a8;
  ulong local_8a0;
  ulong local_898;
  ulong local_890;
  uint32_t *local_888;
  ulong local_880;
  long local_878;
  uint32_t *local_870;
  long local_868;
  ulong local_860;
  long local_858;
  ulong local_850;
  long local_848;
  ulong local_840;
  int accumulated_blue_histo [256];
  int accumulated_red_histo [256];
  
  local_8d8 = CONCAT44(in_register_0000003c,width);
  local_8e0 = CONCAT44(in_register_00000034,height);
  bVar6 = (byte)bits;
  uVar7 = 1 << (bVar6 & 0x1f);
  local_8e8 = (ulong)uVar7;
  uVar7 = (uVar7 + height) - 1;
  bVar2 = bVar6 & 0x1f;
  local_8f4 = quality;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  if (0 < (int)(uVar7 >> bVar2)) {
    iVar5 = (int)local_8d8;
    uVar8 = (uint)((int)local_8e8 + -1 + iVar5) >> (bVar6 & 0x1f);
    local_8a0 = (ulong)uVar8;
    local_878 = (long)(iVar5 + 2);
    local_8b0 = (long)(int)uVar8;
    local_880 = (ulong)(uVar7 >> bVar2);
    local_868 = (long)iVar5 * 4;
    local_870 = argb + -(long)iVar5;
    local_850 = 0;
    local_8f8 = 0;
    local_8fc = 0;
    local_900 = 0;
    uVar8 = 0;
    uVar7 = 0 >> bVar2;
    local_8f0 = 0;
    local_8c0 = bits;
    local_8a8 = image;
    local_888 = argb;
    do {
      if (0 < (int)local_8a0) {
        uVar9 = (int)local_850 << ((byte)bits & 0x1f);
        local_890 = (ulong)uVar9;
        local_8bc = uVar9 + (int)local_8e8;
        uVar10 = (uint)local_8e0;
        if ((int)uVar10 <= (int)local_8bc) {
          local_8bc = uVar10;
        }
        local_858 = local_850 * local_8b0;
        local_860 = (ulong)(uVar10 - uVar9);
        if ((int)local_8e8 < (int)(uVar10 - uVar9)) {
          local_860 = local_8e8 & 0xffffffff;
        }
        local_898 = (ulong)(uVar9 * (int)local_8d8);
        local_8c4 = (int)local_860 + 1;
        local_840 = 0;
        do {
          puVar12 = local_8a8;
          iVar15 = (int)local_840;
          uVar10 = iVar15 << ((byte)bits & 0x1f);
          local_8d0 = (ulong)uVar10;
          local_8ec = (int)local_8e8 + uVar10;
          iVar5 = (int)local_8d8;
          if (iVar5 <= local_8ec) {
            local_8ec = iVar5;
          }
          local_848 = local_840 + local_858;
          uVar3 = (uint3)uVar8 & 0xff;
          if (local_850 == 0) {
            VVar4 = GetBestColorTransformForTile
                              (iVar15,0,bits,
                               (VP8LMultipliers)
                               ((uint3)(((local_8f0 & 0xff) << 8 | uVar7 & 0xff) << 8) | uVar3),
                               (VP8LMultipliers)
                               ((uint3)(byte)local_8f8 |
                               (uint3)(byte)local_8fc << 8 | (uint3)(byte)local_900 << 0x10),
                               local_8f4,iVar5,(int)local_8e0,accumulated_red_histo,
                               accumulated_blue_histo,argb);
            local_8b4 = (uint)CONCAT53(extraout_var_00,VVar4);
            local_8b8 = (uint)(CONCAT53(extraout_var_00,VVar4) >> 8);
            puVar12 = local_8a8;
          }
          else {
            local_8f8 = local_8a8[local_848 - local_8b0];
            local_8fc = local_8f8 >> 8;
            local_900 = local_8f8 >> 0x10;
            VVar4 = GetBestColorTransformForTile
                              (iVar15,(int)local_850,bits,
                               (VP8LMultipliers)
                               ((uint3)(((local_8f0 & 0xff) << 8 | uVar7 & 0xff) << 8) | uVar3),
                               SUB43(local_8f8,0),local_8f4,iVar5,(int)local_8e0,
                               accumulated_red_histo,accumulated_blue_histo,argb);
            local_8b4 = (uint)CONCAT53(extraout_var,VVar4);
            local_8b8 = (uint)(CONCAT53(extraout_var,VVar4) >> 8);
          }
          lVar14 = local_868;
          local_8b8 = local_8b8 & 0xffffff;
          uVar7 = local_8b4 & 0xff | local_8b8 << 8;
          local_8f0 = local_8b8 >> 8;
          iVar15 = iVar5 - (int)local_8d0;
          if ((int)local_8e8 < iVar5 - (int)local_8d0) {
            iVar15 = (int)local_8e8;
          }
          puVar12[local_848] = uVar7 | 0xff000000;
          local_904.red_to_blue_ = (uint8_t)(local_8b8 >> 8);
          local_904._0_2_ = SUB42(uVar7,0);
          if (0 < (int)local_860) {
            puVar12 = local_888 + ((int)local_898 + (int)local_8d0);
            uVar7 = local_8c4;
            do {
              (*VP8LTransformColor)(&local_904,puVar12,iVar15);
              uVar7 = uVar7 - 1;
              puVar12 = (uint32_t *)((long)puVar12 + lVar14);
            } while (1 < uVar7);
          }
          if ((int)local_890 < (int)local_8bc) {
            iVar15 = (int)local_8d0;
            iVar5 = (int)local_898 + iVar15;
            uVar11 = local_890;
            do {
              iVar13 = (int)uVar11 * (int)local_8d8;
              if (iVar13 + iVar15 < iVar13 + local_8ec) {
                lVar14 = (long)iVar5;
                iVar13 = local_8ec - iVar15;
                do {
                  uVar7 = local_888[lVar14];
                  if ((((lVar14 < 2) || (uVar7 != local_888[lVar14 + -2])) ||
                      (uVar7 != local_888[lVar14 + -1])) &&
                     (((lVar14 < local_878 || (local_888[lVar14 + -2] != local_870[lVar14 + -2])) ||
                      ((local_888[lVar14 + -1] != local_870[lVar14 + -1] ||
                       (uVar7 != local_870[lVar14])))))) {
                    piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar7 >> 0xe & 0x3fc));
                    *piVar1 = *piVar1 + 1;
                    accumulated_blue_histo[uVar7 & 0xff] = accumulated_blue_histo[uVar7 & 0xff] + 1;
                  }
                  lVar14 = lVar14 + 1;
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
              uVar7 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar7;
              iVar5 = iVar5 + (int)local_8d8;
            } while (uVar7 != local_8bc);
          }
          local_840 = local_840 + 1;
          argb = local_888;
          bits = local_8c0;
          uVar7 = local_8b8;
          uVar8 = local_8b4;
        } while (local_840 != local_8a0);
      }
      local_850 = local_850 + 1;
    } while (local_850 != local_880);
  }
  return;
}

Assistant:

void VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                             uint32_t* const argb, uint32_t* image) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int accumulated_red_histo[256] = { 0 };
  int accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
  }
}